

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall
CMeshClosestPointMapper::AdaptedMatchFaceTC
          (CMeshClosestPointMapper *this,int count,ON_3dPoint *pPts,SamplePoint *pSamplePts,
          int tcCount,ON_3dPoint *pTcsOut,double mappingTol,bool bEqualFaceCheck,
          TcSeamlessPatchCache *patchCache)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ON_Mesh *this_00;
  ON_2fPointArray *pOVar3;
  undefined8 uVar4;
  ON_3dVector delta;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  TcSeamlessPatch *pTVar8;
  ON_MeshFace *this_01;
  ON_3dPoint *pOVar9;
  int i_3;
  int pti;
  int i;
  long lVar10;
  ulong uVar11;
  int pti_1;
  byte bVar12;
  int i_1;
  long lVar13;
  double dVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ON_SimpleArray<int> commonFis;
  double local_140;
  ON_SimpleArray<int> newCommonFis;
  ON_3dPointArray bestTcs;
  int local_d8 [4];
  double tol [4];
  ON_SimpleArray<int> allFis;
  ON_3dVector local_78;
  ON_BoundingBox samplePointBbox;
  
  ON_BoundingBox::ON_BoundingBox(&samplePointBbox);
  commonFis._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081add8;
  commonFis.m_a = (int *)0x0;
  commonFis.m_count = 0;
  commonFis.m_capacity = 0;
  allFis._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081add8;
  allFis.m_a = (int *)0x0;
  allFis.m_count = 0;
  allFis.m_capacity = 0;
  uVar11 = 0;
  uVar7 = 0;
  if (0 < count) {
    uVar7 = (ulong)(uint)count;
  }
  for (; uVar11 != uVar7; uVar11 = uVar11 + 1) {
    pOVar9 = pPts + uVar11;
    ON_BoundingBox::Set(&samplePointBbox,pOVar9,1);
    tol[0] = pOVar9->x;
    tol[1] = pOVar9->y;
    tol[2] = pOVar9->z;
    if (-1 < (this->m_resFis).m_capacity) {
      (this->m_resFis).m_count = 0;
    }
    tol[3] = mappingTol;
    ON_RTree::Search(this->m_pMeshFaceTree,(ON_RTreeSphere *)tol,RTreeCallback,this);
    if (uVar11 == 0) {
      ON_SimpleArray<int>::operator=(&commonFis,&this->m_resFis);
    }
    else {
      ON_SimpleArray<int>::ON_SimpleArray(&newCommonFis,(long)commonFis.m_count);
      lVar13 = 0;
      for (lVar10 = 0; lVar10 < commonFis.m_count; lVar10 = lVar10 + 1) {
        iVar6 = ON_SimpleArray<int>::Search(&this->m_resFis,(int *)((long)commonFis.m_a + lVar13));
        if (-1 < iVar6) {
          ON_SimpleArray<int>::Append(&newCommonFis,(int *)((long)commonFis.m_a + lVar13));
        }
        lVar13 = lVar13 + 4;
      }
      ON_SimpleArray<int>::operator=(&commonFis,&newCommonFis);
      ON_SimpleArray<int>::~ON_SimpleArray(&newCommonFis);
    }
    for (lVar10 = 0; lVar10 < (this->m_resFis).m_count; lVar10 = lVar10 + 1) {
      newCommonFis._vptr_ON_SimpleArray =
           (_func_int **)
           CONCAT44(newCommonFis._vptr_ON_SimpleArray._4_4_,(this->m_resFis).m_a[lVar10]);
      iVar6 = ON_SimpleArray<int>::Search(&allFis,(int *)&newCommonFis);
      if (iVar6 < 0) {
        ON_SimpleArray<int>::Append(&allFis,(int *)&newCommonFis);
      }
    }
  }
  if (bEqualFaceCheck) {
    ON_3dPointArray::ON_3dPointArray(&bestTcs,tcCount);
    uVar7 = (ulong)(uint)tcCount;
    local_140 = 1.79769313486232e+308;
    for (lVar10 = 0; lVar10 < commonFis.m_count; lVar10 = lVar10 + 1) {
      iVar6 = commonFis.m_a[lVar10];
      if (((-1 < (long)iVar6) && (0xfffffffd < tcCount - 5U)) &&
         (this_00 = this->m_mesh, iVar6 < (this_00->m_F).m_count)) {
        pOVar3 = this->m_tc;
        this_01 = (this_00->m_F).m_a + iVar6;
        bVar5 = ON_MeshFace::IsQuad(this_01);
        local_d8[0] = -1;
        local_d8[1] = 0xffffffff;
        local_d8[2] = 0xffffffff;
        local_d8[3] = 0xffffffff;
        tol[2] = 1.79769313486232e+308;
        tol[3] = 1.79769313486232e+308;
        tol[0] = 1.79769313486232e+308;
        tol[1] = 1.79769313486232e+308;
        for (lVar13 = 0; lVar13 != (ulong)bVar5 + 3; lVar13 = lVar13 + 1) {
          ON_Mesh::Vertex((ON_3dPoint *)&newCommonFis,this_00,this_01->vi[lVar13]);
          pOVar9 = pPts;
          for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
            dVar14 = ON_3dPoint::DistanceTo(pOVar9,(ON_3dPoint *)&newCommonFis);
            if ((local_d8[uVar11] == -1) || (dVar14 < tol[uVar11])) {
              local_d8[uVar11] = this_01->vi[lVar13];
              tol[uVar11] = dVar14;
            }
            pOVar9 = pOVar9 + 1;
          }
        }
        uVar15 = 0;
        uVar16 = 0;
        for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
          if (local_d8[uVar11] == -1) goto LAB_004fde27;
          dVar14 = tol[uVar11];
          if (dVar14 <= (double)CONCAT44(uVar16,uVar15)) {
            dVar14 = (double)CONCAT44(uVar16,uVar15);
          }
          uVar15 = SUB84(dVar14,0);
          uVar16 = (undefined4)((ulong)dVar14 >> 0x20);
        }
        if ((double)CONCAT44(uVar16,uVar15) < mappingTol ||
            (double)CONCAT44(uVar16,uVar15) == mappingTol) {
          pOVar9 = pTcsOut;
          for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
            ON_3dPoint::ON_3dPoint
                      ((ON_3dPoint *)&newCommonFis,
                       (pOVar3->super_ON_SimpleArray<ON_2fPoint>).m_a + local_d8[uVar11]);
            pOVar9->z = (double)newCommonFis._16_8_;
            pOVar9->x = (double)newCommonFis._vptr_ON_SimpleArray;
            pOVar9->y = (double)newCommonFis.m_a;
            pOVar9 = pOVar9 + 1;
          }
          if (((double)CONCAT44(uVar16,uVar15) == 0.0) && (!NAN((double)CONCAT44(uVar16,uVar15))))
          goto LAB_004fde79;
          if ((double)CONCAT44(uVar16,uVar15) <= local_140 &&
              local_140 != (double)CONCAT44(uVar16,uVar15)) {
            if (-1 < bestTcs.super_ON_SimpleArray<ON_3dPoint>.m_capacity) {
              bestTcs.super_ON_SimpleArray<ON_3dPoint>.m_count = 0;
            }
            ON_SimpleArray<ON_3dPoint>::Append
                      (&bestTcs.super_ON_SimpleArray<ON_3dPoint>,tcCount,pTcsOut);
            local_140 = (double)CONCAT44(uVar16,uVar15);
          }
        }
      }
LAB_004fde27:
    }
    if (local_140 < mappingTol) {
      uVar11 = 0;
      uVar7 = (ulong)(uint)tcCount;
      if (tcCount < 1) {
        uVar7 = uVar11;
      }
      for (; uVar7 * 0x18 - uVar11 != 0; uVar11 = uVar11 + 0x18) {
        *(undefined8 *)((long)&pTcsOut->z + uVar11) =
             *(undefined8 *)((long)&(bestTcs.super_ON_SimpleArray<ON_3dPoint>.m_a)->z + uVar11);
        puVar1 = (undefined8 *)((long)&(bestTcs.super_ON_SimpleArray<ON_3dPoint>.m_a)->x + uVar11);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pTcsOut->x + uVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
      }
LAB_004fde79:
      ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&bestTcs.super_ON_SimpleArray<ON_3dPoint>);
      bVar5 = true;
      goto LAB_004fdf0f;
    }
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&bestTcs.super_ON_SimpleArray<ON_3dPoint>);
  }
  if (commonFis.m_count < 1) {
    bVar12 = 0;
    newCommonFis._vptr_ON_SimpleArray = (_func_int **)mappingTol;
    for (lVar10 = 0; lVar10 < allFis.m_count; lVar10 = lVar10 + 1) {
      pTVar8 = TcSeamlessPatchCache::Get(patchCache,allFis.m_a[lVar10]);
      tol[0] = (pTVar8->m_bbox).m_min.x;
      tol[1] = (pTVar8->m_bbox).m_min.y;
      tol[2] = (pTVar8->m_bbox).m_min.z;
      tol[3] = (pTVar8->m_bbox).m_max.x;
      ON_3dVector::ON_3dVector
                (&local_78,(double)newCommonFis._vptr_ON_SimpleArray,
                 (double)newCommonFis._vptr_ON_SimpleArray,(double)newCommonFis._vptr_ON_SimpleArray
                );
      delta.y = local_78.y;
      delta.x = local_78.x;
      delta.z = local_78.z;
      ON_BoundingBox::Expand((ON_BoundingBox *)tol,delta);
      bVar5 = ON_BoundingBox::Includes((ON_BoundingBox *)tol,&samplePointBbox,false);
      if (bVar5) {
        bVar5 = TcSeamlessPatch::Evaluate
                          (pTVar8,count,pSamplePts,(double *)&newCommonFis,tcCount,pTcsOut);
        bVar12 = bVar12 | bVar5;
      }
    }
  }
  else {
    bVar12 = 0;
    tol[0] = mappingTol;
    for (lVar10 = 0; lVar10 < commonFis.m_count; lVar10 = lVar10 + 1) {
      pTVar8 = TcSeamlessPatchCache::Get(patchCache,commonFis.m_a[lVar10]);
      bVar5 = TcSeamlessPatch::Evaluate(pTVar8,count,pSamplePts,tol,tcCount,pTcsOut);
      bVar12 = bVar12 | bVar5;
    }
  }
  bVar5 = true;
  if (bVar12 == 0) {
    bVar5 = false;
  }
LAB_004fdf0f:
  ON_SimpleArray<int>::~ON_SimpleArray(&allFis);
  ON_SimpleArray<int>::~ON_SimpleArray(&commonFis);
  return bVar5;
}

Assistant:

bool AdaptedMatchFaceTC(int count, const ON_3dPoint* pPts, SamplePoint* pSamplePts, int tcCount, ON_3dPoint* pTcsOut, double mappingTol, bool bEqualFaceCheck, TcSeamlessPatchCache& patchCache) const
	{
		// This code is dummy iteration through all faces to find a matching one
		//double minTol = DBL_MAX;
		//double matchTol = DBL_MAX;
		//int matchFi = -1;
		//for (int fi = 0; fi < m_mesh.m_F.Count(); fi++)
		//{
		//  double tol = 0.0;
		//  if (MatchFace(m_mesh, m_tc, fi, mappingTol, count, pPts, pTcsOut, tol))
		//  {
		//    if (tol < matchTol)
		//    {
		//      matchFi = fi;
		//      matchTol = tol;
		//    }
		//    //return true; // Uncomment this to return here
		//  }
		//  if (tol < minTol)
		//  {
		//    minTol = tol;
		//  }
		//}

		ON_BoundingBox samplePointBbox;
		ON_SimpleArray<int> commonFis;
		ON_SimpleArray<int> allFis;
		for (int fvi = 0; fvi < count; fvi++)
		{
			samplePointBbox.Set(pPts[fvi], 1);
			ON_RTreeSphere sphere;
			sphere.m_point[0] = pPts[fvi].x;
			sphere.m_point[1] = pPts[fvi].y;
			sphere.m_point[2] = pPts[fvi].z;
			sphere.m_radius = mappingTol;
			m_resFis.SetCount(0);
			m_pMeshFaceTree->Search(&sphere, RTreeCallback, (void*)this);
			if (fvi == 0)
			{
				commonFis = m_resFis;
			}
			else
			{
				ON_SimpleArray<int> newCommonFis(commonFis.Count());
				for (int i = 0; i < commonFis.Count(); i++)
				{
					if (m_resFis.Search(commonFis[i]) >= 0)
						newCommonFis.Append(commonFis[i]);
				}
				commonFis = newCommonFis;
			}
			for (int i = 0; i < m_resFis.Count(); i++)
				AddIfNotIncluded(allFis, m_resFis[i]);
		}

    if (bEqualFaceCheck)
    {
      double bestTol = DBL_MAX;
      ON_3dPointArray bestTcs(tcCount);
      for (int i = 0; i < commonFis.Count(); i++)
      {
        double tol = 0.0;
        if (MatchFace(m_mesh, m_tc, commonFis[i], mappingTol, tcCount, pPts, pTcsOut, tol))
        {
          if (tol == 0.0)
          {
            return true;
          }
          else if (tol < bestTol)
          {
            bestTcs.SetCount(0);
            bestTcs.Append(tcCount, pTcsOut);
            bestTol = tol;
          }
        }
      }
      if (bestTol < mappingTol)
      {
        for (int pi = 0; pi < tcCount; pi++)
        {
          pTcsOut[pi] = bestTcs[pi];
        }
        return true;
      }
    }

    if (commonFis.Count() > 0)
    {
      bool bSuccess = false;
      double maxDist = mappingTol;
      for (int i = 0; i < commonFis.Count(); i++)
      {
        const TcSeamlessPatch& sp = patchCache.Get(commonFis[i]);
        if (sp.Evaluate(count, pSamplePts, maxDist, tcCount, pTcsOut))
        {
          bSuccess = true;
        }
      }
      if (bSuccess)
        return true;
    }
    else
    {
      bool bSuccess = false;
      double maxDist = mappingTol;
      for (int i = 0; i < allFis.Count(); i++)
      {
        const TcSeamlessPatch& sp = patchCache.Get(allFis[i]);
        ON_BoundingBox patchMaxDistBb(sp.BBox());
        patchMaxDistBb.Expand(ON_3dVector(maxDist, maxDist, maxDist));
        if (patchMaxDistBb.Includes(samplePointBbox))
        {
          if (sp.Evaluate(count, pSamplePts, maxDist, tcCount, pTcsOut))
          {
            bSuccess = true;
          }
        }
      }
      if (bSuccess)
        return true;
    }


		return false;
	}